

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

mcpl_outfile_t mcpl_forcemerge_files(char *file_output,uint nfiles,char **files,int keep_userflags)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  mcpl_fileinternal_t *f;
  mcpl_outfile_t mVar9;
  mcpl_file_t mVar10;
  mcpl_particle_t *pmVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  mcpl_fileinternal_t *f_3;
  mcu8str fn;
  double local_68;
  mcu8str local_48;
  
  if (nfiles == 0) {
    pcVar14 = "mcpl_forcemerge_files must be called with at least one input file";
  }
  else {
    mcpl_error_on_dups(nfiles,files);
    mcu8str_view_cstr(&local_48,file_output);
    iVar8 = mctools_is_file(&local_48);
    if (iVar8 == 0) {
      if (nfiles != 1) {
        uVar13 = 1;
        do {
          iVar8 = mcpl_can_merge(*files,files[uVar13]);
          if (iVar8 == 0) {
            uVar13 = 0;
            bVar6 = false;
            bVar5 = false;
            bVar4 = false;
            bVar7 = false;
            local_68 = 0.0;
            bVar2 = false;
            iVar8 = 0;
            goto LAB_00104719;
          }
          uVar13 = uVar13 + 1;
        } while (nfiles != uVar13);
      }
      printf("MCPL mcpl_forcemerge_files called with %i files that are compatible for a standard merge => falling back to standard mcpl_merge_files function\n"
             ,(ulong)nfiles);
      mVar9 = mcpl_merge_files(file_output,nfiles,files);
      return (mcpl_outfile_t)mVar9.internal;
    }
    pcVar14 = "requested output file of mcpl_forcemerge_files already exists";
  }
  (*mcpl_error_handler)(pcVar14);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
LAB_00104719:
  local_48.c_str._0_4_ = 0;
  mVar10 = mcpl_actual_open_file(files[uVar13],(int *)&local_48);
  dVar1 = local_68;
  if (*(long *)((long)mVar10.internal + 0x40) != 0) {
    if (*(int *)((long)mVar10.internal + 0x1c) != 0) {
      bVar4 = true;
    }
    if (*(int *)((long)mVar10.internal + 0x20) != 0) {
      bVar5 = true;
    }
    bVar3 = true;
    if (*(int *)((long)mVar10.internal + 0x24) != 0) {
      bVar3 = bVar6;
    }
    bVar6 = bVar3;
    iVar15 = *(int *)((long)mVar10.internal + 0x28);
    if (iVar15 == 0) {
      iVar15 = iVar8;
      bVar2 = true;
    }
    else {
      bVar3 = true;
      if (iVar8 == iVar15) {
        bVar3 = bVar2;
      }
      if (iVar8 != 0) {
        iVar15 = iVar8;
        bVar2 = bVar3;
      }
    }
    dVar1 = *(double *)((long)mVar10.internal + 0x30);
    iVar8 = iVar15;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if ((local_68 != 0.0) || (NAN(local_68))) {
        if ((local_68 != dVar1) || (NAN(local_68) || NAN(dVar1))) goto LAB_001047af;
      }
    }
    else {
LAB_001047af:
      bVar7 = true;
      dVar1 = local_68;
    }
  }
  local_68 = dVar1;
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar10.internal);
  uVar13 = uVar13 + 1;
  if (nfiles == uVar13) {
    mVar9 = mcpl_create_outfile(file_output);
    pcVar14 = "mcpl_forcemerge_files (from MCPL v2.0.0)";
    if (mcpl_internal_fakeconstantversion_fakev != '\0') {
      pcVar14 = "mcpl_forcemerge_files (from MCPL v99.99.99)";
    }
    mcpl_hdr_set_srcname(mVar9,pcVar14);
    if ((keep_userflags != 0) && (bVar4)) {
      mcpl_enable_userflags(mVar9);
    }
    if (bVar5) {
      mcpl_enable_polarisation(mVar9);
    }
    if (bVar6) {
      mcpl_enable_doubleprec(mVar9);
    }
    if ((!bVar2) && (iVar8 != 0)) {
      mcpl_enable_universal_pdgcode(mVar9,iVar8);
    }
    if ((!bVar7) && ((local_68 != 0.0 || (NAN(local_68))))) {
      mcpl_enable_universal_weight(mVar9,local_68);
    }
    pcVar14 = "s";
    uVar13 = 0;
    do {
      local_48.c_str._0_4_ = 0;
      mVar10 = mcpl_actual_open_file(files[uVar13],(int *)&local_48);
      pcVar12 = "s";
      if (*(long *)((long)mVar10.internal + 0x40) == 1) {
        pcVar12 = "";
      }
      printf("MCPL force-merge: Transferring %lu particle%s from file %s\n",
             *(long *)((long)mVar10.internal + 0x40),pcVar12,files[uVar13]);
      while (pmVar11 = mcpl_read(mVar10), pmVar11 != (mcpl_particle_t *)0x0) {
        mcpl_transfer_last_read_particle(mVar10,mVar9);
      }
      mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar10.internal);
      uVar13 = uVar13 + 1;
    } while (uVar13 != nfiles + (nfiles == 0));
    if (*(long *)((long)mVar9.internal + 0x68) == 1) {
      pcVar14 = "";
    }
    printf("MCPL force-merge: Transferred a total of %lu particle%s to new file %s\n",
           *(long *)((long)mVar9.internal + 0x68),pcVar14,file_output);
    return (mcpl_outfile_t)mVar9.internal;
  }
  goto LAB_00104719;
}

Assistant:

mcpl_outfile_t mcpl_forcemerge_files( const char * file_output,
                                      unsigned nfiles,
                                      const char ** files,
                                      int keep_userflags )
{
  ////////////////////////////////////
  // Initial sanity check of input: //
  ////////////////////////////////////

  if (!nfiles)
    mcpl_error("mcpl_forcemerge_files must be called"
               " with at least one input file");

  mcpl_error_on_dups(nfiles,files);

  //Create new file:
  if (mcpl_file_certainly_exists(file_output))
    mcpl_error("requested output file of mcpl_forcemerge_files already exists");

  ///////////////////////////////////////////
  // Fallback to normal merge if possible: //
  ///////////////////////////////////////////

  //Check all files for compatibility before we start (for robustness, we check
  //again when actually merging each file).
  unsigned ifile;
  int normal_merge_ok = 1;
  for (ifile = 1; ifile < nfiles; ++ifile) {
    if (!mcpl_can_merge(files[0],files[ifile])) {
      normal_merge_ok = 0;
      break;
    }
  }
  if (normal_merge_ok) {
    printf("MCPL mcpl_forcemerge_files called with %i files that are"
           " compatible for a standard merge => falling back to"
           " standard mcpl_merge_files function\n",nfiles);
    return mcpl_merge_files(file_output,nfiles,files);
  }

  /////////////////////////////
  // Actual forcemerge code: //
  /////////////////////////////

  //Run through files and collect meta-data:
  int opt_dp = 0;
  int opt_pol = 0;
  int opt_uf = 0;
  int lastseen_universalpdg = 0;
  int disallow_universalpdg = 0;
  double lastseen_universalweight = 0;
  int disallow_universalweight = 0;

  for (ifile = 0; ifile < nfiles; ++ifile) {
    mcpl_file_t f = mcpl_open_file(files[ifile]);
    if (!mcpl_hdr_nparticles(f)) {
      mcpl_close_file(f);
      continue;//won't affect anything
    }

    if (mcpl_hdr_has_userflags(f))
      opt_uf = 1;//enable if any

    if (mcpl_hdr_has_polarisation(f))
      opt_pol = 1;//enable if any

    if (mcpl_hdr_has_doubleprec(f))
      opt_dp = 1;

    int32_t updg = mcpl_hdr_universal_pdgcode(f);
    if ( !updg
         || ( lastseen_universalpdg && lastseen_universalpdg != updg ) ) {
      disallow_universalpdg = 1;
    } else {
      lastseen_universalpdg = updg;
    }
    double uw = mcpl_hdr_universal_weight(f);
    if ( !uw
         || ( lastseen_universalweight && lastseen_universalweight != uw ) ) {
      disallow_universalweight = 1;
    } else {
      lastseen_universalweight = uw;
    }
    mcpl_close_file(f);
  }
  if (!keep_userflags)
    opt_uf = 0;

  mcpl_outfile_t out = mcpl_create_outfile(file_output);

  if ( mcpl_internal_fakeconstantversion(0) )
    mcpl_hdr_set_srcname(out,"mcpl_forcemerge_files (from MCPL v" "99.99.99" ")");
  else
    mcpl_hdr_set_srcname(out,"mcpl_forcemerge_files (from MCPL v" MCPL_VERSION_STR ")");
  if ( opt_uf )
    mcpl_enable_userflags(out);
  if ( opt_pol )
    mcpl_enable_polarisation(out);
  if (opt_dp)
    mcpl_enable_doubleprec(out);
  if ( !disallow_universalpdg && lastseen_universalpdg )
    mcpl_enable_universal_pdgcode(out,lastseen_universalpdg);
  if ( !disallow_universalweight && lastseen_universalweight )
    mcpl_enable_universal_weight(out,lastseen_universalweight);

  //Finally, perform the transfer:
  for (ifile = 0; ifile < nfiles; ++ifile) {
    mcpl_file_t f = mcpl_open_file(files[ifile]);
    uint64_t np = mcpl_hdr_nparticles(f);
    printf("MCPL force-merge: Transferring %" PRIu64
           " particle%s from file %s\n",
           np,(np==1?"":"s"),files[ifile]);
    while ( mcpl_read(f) != 0 )
      mcpl_transfer_last_read_particle(f, out);//lossless transfer when possible
    mcpl_close_file(f);
  }

  mcpl_outfileinternal_t * out_internal = (mcpl_outfileinternal_t *)out.internal;
  uint64_t np = out_internal->nparticles;
  printf("MCPL force-merge: Transferred a total of %" PRIu64
         " particle%s to new file %s\n",
         np,(np==1?"":"s"),file_output);
  return out;
}